

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPutOnTop(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *pFileName;
  int iVar1;
  Io_FileType_t FileType;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Abc_Ntk_t *pAVar5;
  Abc_Ntk_t *pNtk_00;
  int c;
  int fComb;
  char *FileName;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar5 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"ch"), iVar1 != -1) {
    if (iVar1 != 99) {
      Abc_Print(-2,"usage: putontop [-h] <file>\n");
      Abc_Print(-2,"\t         connects PIs of network in <file> to POs of current network\n");
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\t<file> : file name with the second network\n");
      return 1;
    }
  }
  if (argc != globalUtilOptind + 1) {
    Abc_Print(-1,"The network to append is not given.\n");
    return 1;
  }
  iVar1 = Abc_NtkIsLogic(pAVar5);
  if (iVar1 == 0) {
    Abc_Print(-1,"The base network should be in the logic form.\n");
    return 1;
  }
  iVar1 = Abc_NtkLatchNum(pAVar5);
  if (iVar1 != 0) {
    Abc_Print(-1,"The current network has latches. This command does not work for such networks.\n")
    ;
    return 0;
  }
  pFileName = argv[globalUtilOptind];
  FileType = Io_ReadFileType(pFileName);
  pNtk_00 = Io_Read(pFileName,FileType,1,0);
  if (pNtk_00 == (Abc_Ntk_t *)0x0) {
    return 1;
  }
  iVar1 = Abc_NtkLatchNum(pNtk_00);
  if (iVar1 != 0) {
    Abc_NtkDelete(pNtk_00);
    Abc_Print(-1,"The second network has latches. This command does not work for such networks.\n");
    return 0;
  }
  iVar1 = Abc_NtkPoNum(pAVar5);
  iVar2 = Abc_NtkPiNum(pNtk_00);
  if (iVar1 != iVar2) {
    Abc_NtkDelete(pNtk_00);
    uVar3 = Abc_NtkPoNum(pAVar5);
    uVar4 = Abc_NtkPiNum(pNtk_00);
    Abc_Print(-1,
              "The PO count (%d) of the first network is not equal to PI count (%d) of the second network.\n"
              ,(ulong)uVar3,(ulong)uVar4);
    return 0;
  }
  pAVar5 = Abc_NtkPutOnTop(pAVar5,pNtk_00);
  Abc_NtkDelete(pNtk_00);
  Abc_FrameReplaceCurrentNetwork(pAbc,pAVar5);
  return 0;
}

Assistant:

int Abc_CommandPutOnTop( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkPutOnTop( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtk2 );

    Abc_Ntk_t * pNtk, * pNtk2, * pNtkRes;
    char * FileName;
    int fComb = 0;
    int c;
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ch" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fComb ^= 1;
            break;
        default:
            goto usage;
        }
    }

    // get the second network
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( -1, "The network to append is not given.\n" );
        return 1;
    }

    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "The base network should be in the logic form.\n" );
        return 1;
    }

    // check if the second network is combinational
    if ( Abc_NtkLatchNum(pNtk) )
    {
        Abc_Print( -1, "The current network has latches. This command does not work for such networks.\n" );
        return 0;
    }

    // read the second network
    FileName = argv[globalUtilOptind];
    pNtk2 = Io_Read( FileName, Io_ReadFileType(FileName), 1, 0 );
    if ( pNtk2 == NULL )
        return 1;

    // check if the second network is combinational
    if ( Abc_NtkLatchNum(pNtk2) )
    {
        Abc_NtkDelete( pNtk2 );
        Abc_Print( -1, "The second network has latches. This command does not work for such networks.\n" );
        return 0;
    }
    // compare inputs/outputs
    if ( Abc_NtkPoNum(pNtk) != Abc_NtkPiNum(pNtk2) )
    {
        Abc_NtkDelete( pNtk2 );
        Abc_Print( -1, "The PO count (%d) of the first network is not equal to PI count (%d) of the second network.\n", Abc_NtkPoNum(pNtk), Abc_NtkPiNum(pNtk2) );
        return 0;
    }

    // get the new network
    pNtkRes = Abc_NtkPutOnTop( pNtk, pNtk2 );
    Abc_NtkDelete( pNtk2 );
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: putontop [-h] <file>\n" );
    Abc_Print( -2, "\t         connects PIs of network in <file> to POs of current network\n" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file name with the second network\n");
    return 1;
}